

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

void half_to_float_buffer(float *out,uint16_t *in,int w)

{
  float *out_00;
  int in_EDX;
  uint16_t *in_RSI;
  float *in_RDI;
  float fVar1;
  uint16_t *in_stack_ffffffffffffffd8;
  float *in_stack_ffffffffffffffe0;
  int local_14;
  uint16_t *local_10;
  float *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_14 = in_EDX; 7 < local_14; local_14 = local_14 + -8) {
    half_to_float8(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    local_8 = local_8 + 8;
    local_10 = local_10 + 8;
  }
  out_00 = (float *)(ulong)(local_14 - 1);
  switch(out_00) {
  case (float *)0x0:
    fVar1 = half_to_float(*local_10);
    *local_8 = fVar1;
    break;
  case (float *)0x1:
    fVar1 = half_to_float(*local_10);
    *local_8 = fVar1;
    fVar1 = half_to_float(local_10[1]);
    local_8[1] = fVar1;
    break;
  case (float *)0x2:
    fVar1 = half_to_float(*local_10);
    *local_8 = fVar1;
    fVar1 = half_to_float(local_10[1]);
    local_8[1] = fVar1;
    fVar1 = half_to_float(local_10[2]);
    local_8[2] = fVar1;
    break;
  case (float *)0x3:
    half_to_float4(out_00,in_stack_ffffffffffffffd8);
    break;
  case (float *)0x4:
    half_to_float4(out_00,in_stack_ffffffffffffffd8);
    fVar1 = half_to_float(local_10[4]);
    local_8[4] = fVar1;
    break;
  case (float *)0x5:
    half_to_float4(out_00,in_stack_ffffffffffffffd8);
    fVar1 = half_to_float(local_10[4]);
    local_8[4] = fVar1;
    fVar1 = half_to_float(local_10[5]);
    local_8[5] = fVar1;
    break;
  case (float *)0x6:
    half_to_float4(out_00,in_stack_ffffffffffffffd8);
    fVar1 = half_to_float(local_10[4]);
    local_8[4] = fVar1;
    fVar1 = half_to_float(local_10[5]);
    local_8[5] = fVar1;
    fVar1 = half_to_float(local_10[6]);
    local_8[6] = fVar1;
  }
  return;
}

Assistant:

static inline void
half_to_float_buffer (float* out, const uint16_t* in, int w)
{
#    if EXR_HOST_IS_NOT_LITTLE_ENDIAN
    for (int x = 0; x < w; ++x)
        out[x] = half_to_float (one_to_native16 (in[x]));
#    else
    while (w >= 8)
    {
        half_to_float8 (out, in);
        out += 8;
        in += 8;
        w -= 8;
    }
    switch (w)
    {
        case 7:
            half_to_float4 (out, in);
            out[4] = half_to_float (in[4]);
            out[5] = half_to_float (in[5]);
            out[6] = half_to_float (in[6]);
            break;
        case 6:
            half_to_float4 (out, in);
            out[4] = half_to_float (in[4]);
            out[5] = half_to_float (in[5]);
            break;
        case 5:
            half_to_float4 (out, in);
            out[4] = half_to_float (in[4]);
            break;
        case 4: half_to_float4 (out, in); break;
        case 3:
            out[0] = half_to_float (in[0]);
            out[1] = half_to_float (in[1]);
            out[2] = half_to_float (in[2]);
            break;
        case 2:
            out[0] = half_to_float (in[0]);
            out[1] = half_to_float (in[1]);
            break;
        case 1: out[0] = half_to_float (in[0]); break;
    }
#    endif
}